

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

void bcf_header_debug(bcf_hdr_t *hdr)

{
  long lVar1;
  
  if (0 < hdr->nhrec) {
    lVar1 = 0;
    do {
      if (hdr->hrec[lVar1]->value == (char *)0x0) {
        bcf_header_debug_cold_1();
      }
      else {
        fprintf(_stderr,"##%s=%s\n",hdr->hrec[lVar1]->key);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < hdr->nhrec);
  }
  return;
}

Assistant:

void bcf_header_debug(bcf_hdr_t *hdr)
{
    int i, j;
    for (i=0; i<hdr->nhrec; i++)
    {
        if ( !hdr->hrec[i]->value )
        {
            fprintf(stderr, "##%s=<", hdr->hrec[i]->key);
            fprintf(stderr,"%s=%s", hdr->hrec[i]->keys[0], hdr->hrec[i]->vals[0]);
            for (j=1; j<hdr->hrec[i]->nkeys; j++)
                fprintf(stderr,",%s=%s", hdr->hrec[i]->keys[j], hdr->hrec[i]->vals[j]);
            fprintf(stderr,">\n");
        }
        else
            fprintf(stderr,"##%s=%s\n", hdr->hrec[i]->key,hdr->hrec[i]->value);
    }
}